

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeComputeFreeSpace(MemPage *pPage)

{
  byte bVar1;
  uint uVar2;
  u8 *puVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  ushort uVar10;
  ushort uVar11;
  
  puVar3 = pPage->aData;
  uVar2 = pPage->pBt->usableSize;
  bVar1 = pPage->hdrOffset;
  uVar9 = ((uint)puVar3[(ulong)bVar1 + 5] * 0x100 + (uint)puVar3[(ulong)bVar1 + 6]) - 1 & 0xffff;
  uVar10 = *(ushort *)(puVar3 + (ulong)bVar1 + 1) << 8 | *(ushort *)(puVar3 + (ulong)bVar1 + 1) >> 8
  ;
  iVar7 = puVar3[(ulong)bVar1 + 7] + uVar9 + 1;
  if (uVar10 != 0) {
    if (uVar10 <= uVar9) {
      uVar6 = 0x111c2;
      goto LAB_00165946;
    }
    do {
      uVar9 = (uint)uVar10;
      if ((int)(uVar2 - 4) < (int)uVar9) {
        uVar6 = 0x111c7;
        goto LAB_00165946;
      }
      uVar8 = *(ushort *)(puVar3 + uVar10) << 8 | *(ushort *)(puVar3 + uVar10) >> 8;
      uVar11 = *(ushort *)(puVar3 + (ulong)uVar10 + 2) << 8 |
               *(ushort *)(puVar3 + (ulong)uVar10 + 2) >> 8;
      iVar7 = iVar7 + (uint)uVar11;
      uVar4 = (uint)uVar10;
      uVar10 = uVar8;
    } while (uVar11 + uVar4 + 3 < (uint)uVar8);
    if (uVar8 != 0) {
      uVar6 = 0x111d1;
      goto LAB_00165946;
    }
    if (uVar2 < uVar11 + uVar9) {
      uVar6 = 0x111d5;
      goto LAB_00165946;
    }
  }
  if ((iVar7 <= (int)uVar2) &&
     (iVar5 = (uint)bVar1 + (uint)pPage->childPtrSize + (uint)pPage->nCell * 2 + 8, iVar5 <= iVar7))
  {
    pPage->nFree = iVar7 - iVar5 & 0xffff;
    return 0;
  }
  uVar6 = 0x111e1;
LAB_00165946:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar6,
              "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  return 0xb;
}

Assistant:

static int btreeComputeFreeSpace(MemPage *pPage){
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 hdr;            /* Offset to beginning of page header */
  u8 *data;          /* Equal to pPage->aData */
  int usableSize;    /* Amount of usable space on each page */
  int nFree;         /* Number of unused bytes on the page */
  int top;           /* First byte of the cell content area */
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==1 );
  assert( pPage->nFree<0 );

  usableSize = pPage->pBt->usableSize;
  hdr = pPage->hdrOffset;
  data = pPage->aData;
  /* EVIDENCE-OF: R-58015-48175 The two-byte integer at offset 5 designates
  ** the start of the cell content area. A zero value for this integer is
  ** interpreted as 65536. */
  top = get2byteNotZero(&data[hdr+5]);
  iCellFirst = hdr + 8 + pPage->childPtrSize + 2*pPage->nCell;
  iCellLast = usableSize - 4;

  /* Compute the total free space on the page
  ** EVIDENCE-OF: R-23588-34450 The two-byte integer at offset 1 gives the
  ** start of the first freeblock on the page, or is zero if there are no
  ** freeblocks. */
  pc = get2byte(&data[hdr+1]);
  nFree = data[hdr+7] + top;  /* Init nFree to non-freeblock free space */
  if( pc>0 ){
    u32 next, size;
    if( pc<top ){
      /* EVIDENCE-OF: R-55530-52930 In a well-formed b-tree page, there will
      ** always be at least one cell before the first freeblock.
      */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    while( 1 ){
      if( pc>iCellLast ){
        /* Freeblock off the end of the page */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      next = get2byte(&data[pc]);
      size = get2byte(&data[pc+2]);
      nFree = nFree + size;
      if( next<=pc+size+3 ) break;
      pc = next;
    }
    if( next>0 ){
      /* Freeblock not in ascending order */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    if( pc+size>(unsigned int)usableSize ){
      /* Last freeblock extends past page end */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }

  /* At this point, nFree contains the sum of the offset to the start
  ** of the cell-content area plus the number of free bytes within
  ** the cell-content area. If this is greater than the usable-size
  ** of the page, then the page must be corrupted. This check also
  ** serves to verify that the offset to the start of the cell-content
  ** area, according to the page header, lies within the page.
  */
  if( nFree>usableSize || nFree<iCellFirst ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  pPage->nFree = (u16)(nFree - iCellFirst);
  return SQLITE_OK;
}